

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

visuals_color_cycle * visuals_color_cycle_copy(visuals_color_cycle *original)

{
  ulong local_38;
  size_t copy_step;
  size_t valid_colors;
  size_t step;
  visuals_color_cycle *copy;
  visuals_color_cycle *original_local;
  
  copy_step = 0;
  local_38 = 0;
  if (original == (visuals_color_cycle *)0x0) {
    original_local = (visuals_color_cycle *)0x0;
  }
  else {
    for (valid_colors = 0; valid_colors < original->max_steps; valid_colors = valid_colors + 1) {
      if (original->steps[valid_colors] != original->invalid_color) {
        copy_step = copy_step + 1;
      }
    }
    original_local = visuals_color_cycle_new(original->cycle_name,copy_step,original->invalid_color)
    ;
    if (original_local == (visuals_color_cycle *)0x0) {
      original_local = (visuals_color_cycle *)0x0;
    }
    else {
      for (valid_colors = 0; valid_colors < original->max_steps && local_38 < copy_step;
          valid_colors = valid_colors + 1) {
        if (original->steps[valid_colors] != original->invalid_color) {
          original_local->steps[local_38] = original->steps[valid_colors];
          local_38 = local_38 + 1;
        }
      }
    }
  }
  return original_local;
}

Assistant:

static struct visuals_color_cycle *visuals_color_cycle_copy(struct visuals_color_cycle const *original)
{
	struct visuals_color_cycle *copy = NULL;
	size_t step = 0;
	size_t valid_colors = 0;
	size_t copy_step = 0;

	if (original == NULL) {
		return NULL;
	}

	/* Find the actual number of colors being used by the original cycle. */
	for (step = 0; step < original->max_steps; step++) {
		if (original->steps[step] != original->invalid_color	) {
			valid_colors++;
		}
	}

	copy = visuals_color_cycle_new(original->cycle_name,
								   valid_colors,
								   original->invalid_color);

	if (copy == NULL) {
		return NULL;
	}

	for (step = 0; step < original->max_steps && copy_step < valid_colors; step++) {
		if (original->steps[step] != original->invalid_color) {
			copy->steps[copy_step] = original->steps[step];
			copy_step++;
		}
	}

	return copy;
}